

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn.c
# Opt level: O3

void Dau_TruthEnum(int nVars)

{
  ulong *puVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  int *piVar7;
  void *pvVar8;
  void *pvVar9;
  Vec_Int_t *p;
  int *piVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  timespec ts;
  long local_130;
  timespec local_f8 [12];
  
  iVar4 = clock_gettime(3,local_f8);
  local_130 = -1;
  if (-1 < iVar4) {
    local_130 = local_f8[0].tv_nsec / 1000 + local_f8[0].tv_sec * 1000000;
  }
  uVar14 = 1 << ((byte)nVars & 0x1f);
  cVar3 = (char)uVar14;
  uVar5 = Extra_Factorial(nVars);
  piVar6 = Extra_PermSchedule(nVars);
  piVar7 = Extra_GreyCodeSchedule(nVars);
  uVar19 = 1L << (~(byte)(-1L << ((byte)nVars & 0x3f)) & 0x3f);
  pvVar8 = calloc((long)(1 << (cVar3 - 7U & 0x1f)),8);
  pvVar9 = calloc((long)(1 << (cVar3 - 2U & 0x1f)),8);
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  piVar10 = (int *)malloc(4000);
  p->pArray = piVar10;
  if (6 < (uint)nVars) {
    __assert_fail("nBits >= 0 && nBits <= 64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                  ,0xc2,"word Abc_Tt6Mask(int)");
  }
  if (pvVar8 == (void *)0x0) {
    puts("Cannot alloc memory for marks.");
    return;
  }
  if (pvVar9 == (void *)0x0) {
    puts("Cannot alloc memory for table.");
  }
  uVar15 = 0;
  do {
    iVar4 = (int)uVar15;
    if ((uVar15 & 0x3ffff) == 0) {
      printf("Finished %08x.  Classes = %6d.  ",uVar15 & 0xffffffff,(ulong)(uint)p->nSize);
      iVar16 = 3;
      iVar4 = clock_gettime(3,local_f8);
      if (iVar4 < 0) {
        lVar13 = -1;
      }
      else {
        lVar13 = local_f8[0].tv_nsec / 1000 + local_f8[0].tv_sec * 1000000;
      }
      Abc_Print(iVar16,"%s =","Time");
      Abc_Print(iVar16,"%9.2f sec\n",(double)(lVar13 - local_130) / 1000000.0);
      fflush(_stdout);
    }
    if ((*(ulong *)((long)pvVar8 + (long)(iVar4 >> 6) * 8) >> (uVar15 & 0x3f) & 1) == 0) {
      Vec_IntPush(p,iVar4);
      uVar11 = uVar15;
      if (0 < (int)uVar5) {
        uVar17 = 0;
        do {
          uVar18 = 0;
          do {
            if (uVar11 < uVar19) {
              if (pvVar9 != (void *)0x0) {
                *(int *)((long)pvVar9 + (long)(int)uVar11 * 4) = iVar4;
              }
              puVar1 = (ulong *)((long)pvVar8 + (long)((int)uVar11 >> 6) * 8);
              *puVar1 = *puVar1 | 1L << ((byte)uVar11 & 0x3f);
            }
            uVar12 = ~uVar11 & 0xffffffffffffffffU >> (-cVar3 & 0x3fU);
            if (uVar12 < uVar19) {
              if (pvVar9 != (void *)0x0) {
                *(int *)((long)pvVar9 + (long)(int)uVar12 * 4) = iVar4;
              }
              puVar1 = (ulong *)((long)pvVar8 + (long)((int)uVar12 >> 6) * 8);
              *puVar1 = *puVar1 | 1L << ((byte)uVar12 & 0x3f);
            }
            bVar2 = (byte)(1L << ((byte)piVar7[uVar18] & 0x3f));
            uVar11 = (s_Truths6[piVar7[uVar18]] & uVar11) >> (bVar2 & 0x3f) |
                     uVar11 << (bVar2 & 0x3f) & s_Truths6[piVar7[uVar18]];
            uVar18 = uVar18 + 1;
          } while (uVar14 != uVar18);
          iVar16 = piVar6[uVar17];
          bVar2 = (byte)(1L << ((byte)iVar16 & 0x3f));
          uVar11 = (uVar11 & s_PMasks[iVar16][2]) >> (bVar2 & 0x3f) |
                   (s_PMasks[iVar16][1] & uVar11) << (bVar2 & 0x3f) | s_PMasks[iVar16][0] & uVar11;
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar5);
      }
      if (uVar15 != uVar11) {
        __assert_fail("tTemp == tCur",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn.c"
                      ,0x68,"void Dau_TruthEnum(int)");
      }
    }
    uVar15 = uVar15 + 1;
    if (uVar19 <= uVar15) {
      printf("Computed %d NPN classes of %d variables.  ",(ulong)(uint)p->nSize,(ulong)(uint)nVars);
      iVar16 = 3;
      iVar4 = clock_gettime(3,local_f8);
      if (iVar4 < 0) {
        lVar13 = -1;
      }
      else {
        lVar13 = local_f8[0].tv_nsec / 1000 + local_f8[0].tv_sec * 1000000;
      }
      Abc_Print(iVar16,"%s =","Time");
      Abc_Print(iVar16,"%9.2f sec\n",(double)(lVar13 - local_130) / 1000000.0);
      fflush(_stdout);
    }
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////


////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////
 
/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Dau_TruthEnum(int nVars)
{
    int fUseTable = 1;
    abctime clk = Abc_Clock();
    int nSizeLog = (1<<nVars) -2;
    int nSizeW = 1 << nSizeLog;
    int nPerms  = Extra_Factorial( nVars );
    int nMints  = 1 << nVars;
    int * pPerm = Extra_PermSchedule( nVars );
    int * pComp = Extra_GreyCodeSchedule( nVars );
    word nFuncs = ((word)1 << (((word)1 << nVars)-1));
    word * pPres = ABC_CALLOC( word, 1 << ((1<<nVars)-7) );
    unsigned * pTable = fUseTable ? (unsigned *)ABC_CALLOC(word, nSizeW) : NULL;
    Vec_Int_t * vNpns = Vec_IntAlloc( 1000 );
    word tMask = Abc_Tt6Mask( 1 << nVars );
    word tTemp, tCur;
    int i, k;
    if ( pPres == NULL )
    {
        printf( "Cannot alloc memory for marks.\n" );
        return;
    }
    if ( pTable == NULL )
        printf( "Cannot alloc memory for table.\n" );
    for ( tCur = 0; tCur < nFuncs; tCur++ )
    {
        if ( (tCur & 0x3FFFF) == 0 )
        {
            printf( "Finished %08x.  Classes = %6d.  ", (int)tCur, Vec_IntSize(vNpns) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            fflush(stdout);
        }
        if ( Abc_TtGetBit(pPres, (int)tCur) )
            continue;
        //Extra_PrintBinary( stdout, (unsigned *)&tCur, 16 ); printf( " %04x\n", (int)tCur );
        //Dau_DsdPrintFromTruth( &tCur, 4 ); printf( "\n" );
        Vec_IntPush( vNpns, (int)tCur );
        tTemp = tCur;
        for ( i = 0; i < nPerms; i++ )
        {
            for ( k = 0; k < nMints; k++ )
            {
                if ( tCur < nFuncs )
                {
                    if ( pTable ) pTable[(int)tCur] = tTemp;
                    Abc_TtSetBit( pPres, (int)tCur );
                }
                if ( (tMask & ~tCur) < nFuncs )
                {
                    if ( pTable ) pTable[(int)(tMask & ~tCur)] = tTemp;
                    Abc_TtSetBit( pPres, (int)(tMask & ~tCur) );
                }
                tCur = Abc_Tt6Flip( tCur, pComp[k] );
            }
            tCur = Abc_Tt6SwapAdjacent( tCur, pPerm[i] );
        }
        assert( tTemp == tCur );
    }
    printf( "Computed %d NPN classes of %d variables.  ", Vec_IntSize(vNpns), nVars );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    fflush(stdout);
    Vec_IntFree( vNpns );
    ABC_FREE( pPres );
    ABC_FREE( pPerm );
    ABC_FREE( pComp );
    // write into file
    if ( pTable )
    {
        FILE * pFile;
        int RetValue;
        char pFileName[200];
        sprintf( pFileName, "tableW%d.data", nSizeLog );
        pFile = fopen( pFileName, "wb" );
        RetValue = fwrite( pTable, 8, nSizeW, pFile );
        RetValue = 0;
        fclose( pFile );
        ABC_FREE( pTable );
    }
}